

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

token_t new_id_token(c2m_ctx_t c2m_ctx,pos_t pos,char *id_str)

{
  token_t ptVar1;
  node_t_conflict pnVar2;
  str_t s;
  char *local_40;
  str_t str;
  token_t token;
  char *id_str_local;
  c2m_ctx_t c2m_ctx_local;
  pos_t pos_local;
  
  s = uniq_cstr(c2m_ctx,id_str);
  local_40 = s.s;
  ptVar1 = new_token(c2m_ctx,pos,local_40,0x103,N_IGNORE);
  pnVar2 = new_str_node(c2m_ctx,N_ID,s,pos);
  ptVar1->node = pnVar2;
  return ptVar1;
}

Assistant:

static token_t new_id_token (c2m_ctx_t c2m_ctx, pos_t pos, const char *id_str) {
  token_t token;
  str_t str = uniq_cstr (c2m_ctx, id_str);

  token = new_token (c2m_ctx, pos, str.s, T_ID, N_IGNORE);
  token->node = new_str_node (c2m_ctx, N_ID, str, pos);
  return token;
}